

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNAccu.cpp
# Opt level: O0

void __thiscall NaPNAccumulator::action(NaPNAccumulator *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  NaReal *pNVar4;
  NaVector *pNVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  uint uVar6;
  NaVector *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  iVar2 = (**(code **)(*in_RDI + 0xb0))();
  if (iVar2 == 0) {
    pNVar5 = NaPetriCnInput::data
                       ((NaPetriCnInput *)
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    iVar2 = (*pNVar5->_vptr_NaVector[8])(pNVar5,0);
    in_RDI[0x26] = (long)(*(double *)CONCAT44(extraout_var_00,iVar2) + (double)in_RDI[0x26]);
  }
  else {
    uVar6 = (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    pNVar4 = NaVector::operator[](in_stack_ffffffffffffffe0,uVar6);
    in_RDI[0x26] = (long)((double)in_RDI[0x26] - *pNVar4);
    pNVar5 = NaPetriCnInput::data
                       ((NaPetriCnInput *)
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    iVar2 = (*pNVar5->_vptr_NaVector[8])(pNVar5,0);
    pNVar5 = *(NaVector **)CONCAT44(extraout_var,iVar2);
    pNVar4 = NaVector::operator[](pNVar5,uVar6);
    *pNVar4 = (NaReal)pNVar5;
    pNVar4 = NaVector::operator[](pNVar5,uVar6);
    in_RDI[0x26] = (long)(*pNVar4 + (double)in_RDI[0x26]);
    uVar6 = *(uint *)(in_RDI + 0x25);
    uVar3 = NaVector::dim((NaVector *)(in_RDI + 0x22));
    if (uVar6 < uVar3 - 1) {
      *(int *)(in_RDI + 0x25) = (int)in_RDI[0x25] + 1;
    }
    else {
      *(undefined4 *)(in_RDI + 0x25) = 0;
    }
  }
  lVar1 = in_RDI[0x26];
  pNVar5 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x12));
  iVar2 = (*pNVar5->_vptr_NaVector[8])(pNVar5,0);
  *(long *)CONCAT44(extraout_var_01,iVar2) = lVar1;
  return;
}

Assistant:

void
NaPNAccumulator::action ()
{
    if(get_accum_depth() > 0) {
#ifdef Accum_DEBUG
	NaPrintLog("------------------------------------------------\n"\
		   "begin: iNext=%u  fSum=%g  vBuffer:\n", iNext, fSum);
	vBuffer.print_contents();

	NaPrintLog("depth=%u input=%g\n", get_accum_depth(), in.data()[0]);
#endif // Accum_DEBUG

	fSum -= vBuffer[iNext];

	vBuffer[iNext] = in.data()[0];
#ifdef Accum_DEBUG
	NaPrintLog("intermeadiate: fSum=%g -> %g\n",
		   fSum, fSum + vBuffer[iNext]);
#endif // Accum_DEBUG

	fSum += vBuffer[iNext];
	if(iNext >= vBuffer.dim() - 1)
	    iNext = 0;
	else
	    ++iNext;

#ifdef Accum_DEBUG
	NaPrintLog("end:   iNext=%u  fSum=%g  vBuffer:\n", iNext, fSum);
	vBuffer.print_contents();
#endif // Accum_DEBUG
    } else {
	fSum += in.data()[0];
    }

    sum.data()[0] = fSum;
}